

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O3

void __thiscall
StunMsg_RFC5769SampleIPv4Response_Test::TestBody(StunMsg_RFC5769SampleIPv4Response_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  stun_attr_varsize *attr;
  void *vec_a;
  stun_attr_xor_sockaddr *attr_00;
  stun_attr_msgint *msgint;
  stun_attr_hdr *attr_hdr;
  long lVar6;
  uint uVar7;
  undefined8 *puVar8;
  stun_msg_hdr *psVar9;
  char *pcVar10;
  char *in_R9;
  AssertionResult gtest_ar_;
  sockaddr_in test_addr;
  char software_name [12];
  uint8_t tsx_id [12];
  sockaddr_in ipv4;
  char password [23];
  uint8_t expected_result [80];
  uint8_t buffer [80];
  AssertHelper local_148;
  AssertHelper local_140;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  string local_128;
  undefined8 local_108;
  undefined4 local_100;
  uint8_t local_f8 [16];
  sockaddr local_e8;
  uint8_t local_d8 [32];
  stun_msg_hdr local_b8 [4];
  stun_msg_hdr local_68 [4];
  
  local_108 = 0x6365762074736574;
  local_100 = 0x726f74;
  builtin_memcpy(local_d8,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  puVar8 = &DAT_00149940;
  psVar9 = local_b8;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar1 = *puVar8;
    psVar9->type = (short)uVar1;
    psVar9->length = (short)((ulong)uVar1 >> 0x10);
    psVar9->magic = (int)((ulong)uVar1 >> 0x20);
    puVar8 = puVar8 + 1;
    psVar9 = (stun_msg_hdr *)psVar9->tsx_id;
  }
  local_f8[0] = 0xb7;
  local_f8[1] = 0xe7;
  local_f8[2] = 0xa7;
  local_f8[3] = '\x01';
  local_f8[4] = 0xbc;
  local_f8[5] = '4';
  local_f8[6] = 0xd6;
  local_f8[7] = 0x86;
  local_f8[8] = 0xfa;
  local_f8[9] = 0x87;
  local_f8[10] = 0xdf;
  local_f8[0xb] = 0xae;
  local_e8.sa_family = 2;
  local_e8.sa_data[0] = -0x80;
  local_e8.sa_data[1] = 'U';
  inet_pton(2,"192.0.2.1",local_e8.sa_data + 2);
  local_138.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000050;
  local_148.data_ = (AssertHelperData *)&DAT_00000050;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_128,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&local_138,(unsigned_long *)&local_148);
  if ((char)local_128._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_138);
    if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_128._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x106,pcVar10);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_138.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_138.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_128._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_128._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_138.ptr_._0_4_ = 1;
    iVar4 = stun_msg_verify(local_b8,0x50);
    local_148.data_._0_4_ = iVar4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_128,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&local_138,(int *)&local_148);
    if ((char)local_128._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_138);
      if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)local_128._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x108,pcVar10);
      testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      if (local_138.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_138.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_138.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      stun_msg_hdr_init(local_68,0x101,local_f8);
      stun_attr_varsize_add(local_68,0x8022,&local_108,0xb,' ');
      stun_attr_xor_sockaddr_add(local_68,0x20,&local_e8);
      stun_attr_msgint_add(local_68,local_d8,0x16);
      stun_attr_fingerprint_add(local_68);
      anon_unknown.dwarf_9b60::IsEqual((anon_unknown_dwarf_9b60 *)&local_138,local_b8,local_68,0x50)
      ;
      if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
        testing::Message::Message((Message *)&local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_128,(internal *)&local_138,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x113,local_128._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_148.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_148.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_138.ptr_._0_4_ = 0x101;
      uVar3 = stun_msg_type(local_b8);
      local_148.data_._0_2_ = uVar3;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&local_128,"STUN_BINDING_RESPONSE","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&local_138,(unsigned_short *)&local_148);
      if ((char)local_128._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_138);
        if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)local_128._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x117,pcVar10);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        if (local_138.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_138.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_138.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_138.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000050;
      local_148.data_ = (AssertHelperData *)stun_msg_len(local_b8);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_128,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&local_138,(unsigned_long *)&local_148);
      if ((char)local_128._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_138);
        if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)local_128._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x118,pcVar10);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        if (local_138.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_138.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_138.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      attr = (stun_attr_varsize *)stun_msg_next_attr(local_b8,(stun_attr_hdr *)0x0);
      local_138.ptr_._0_4_ = 0x8022;
      uVar3 = stun_attr_type((stun_attr_hdr *)attr);
      local_148.data_._0_2_ = uVar3;
      testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                ((internal *)&local_128,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 (stun_attr_type *)&local_138,(unsigned_short *)&local_148);
      if ((char)local_128._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_138);
        if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)local_128._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x11b,pcVar10);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        if (local_138.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_138.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_138.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_128._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_138.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000b;
      local_148.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)attr);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_128,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 (unsigned_long *)&local_138,(unsigned_long *)&local_148);
      if ((char)local_128._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_138);
        if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)local_128._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x11c,pcVar10);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        if (local_138.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_138.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_138.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        vec_a = stun_attr_varsize_read(attr);
        anon_unknown.dwarf_9b60::IsEqual((anon_unknown_dwarf_9b60 *)&local_138,vec_a,&local_108,0xb)
        ;
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_128,(internal *)&local_138,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x11e,local_128._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        attr_00 = (stun_attr_xor_sockaddr *)stun_msg_next_attr(local_b8,(stun_attr_hdr *)attr);
        local_138.ptr_._0_4_ = 0x20;
        uVar3 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_148.data_._0_2_ = uVar3;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&local_128,"STUN_ATTR_XOR_MAPPED_ADDRESS","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_138,(unsigned_short *)&local_148);
        if ((char)local_128._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_138);
          if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)local_128._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x121,pcVar10);
          testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          if (local_138.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_138.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_138.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_128._M_dataplus._M_p = (pointer)0x0;
        local_128._M_string_length = 0;
        local_148.data_ = local_148.data_ & 0xffffffff00000000;
        local_140.data_._0_4_ = stun_attr_xor_sockaddr_read(attr_00,local_b8,(sockaddr *)&local_128)
        ;
        testing::internal::CmpHelperEQ<stun_status_type,int>
                  ((internal *)&local_138,"STUN_OK",
                   "stun_attr_xor_sockaddr_read( (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr)"
                   ,(stun_status_type *)&local_148,(int *)&local_140);
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x125,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_148.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,unsigned_short>
                  ((internal *)&local_138,"2","test_addr.sin_family",(int *)&local_148,
                   (unsigned_short *)&local_128);
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x126,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_148.data_._0_2_ = 0x5580;
        testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                  ((internal *)&local_138,"__bswap_16 (32853)","test_addr.sin_port",
                   (unsigned_short *)&local_148,
                   (unsigned_short *)((long)&local_128._M_dataplus._M_p + 2));
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x127,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_148.data_ = local_148.data_ & 0xffffffff00000000;
        uVar5 = local_128._M_dataplus._M_p._4_4_ >> 0x18 |
                (local_128._M_dataplus._M_p._4_4_ & 0xff0000) >> 8 |
                (local_128._M_dataplus._M_p._4_4_ & 0xff00) << 8 |
                local_128._M_dataplus._M_p._4_4_ << 0x18;
        uVar7 = (uint)local_e8.sa_data._2_4_ >> 0x18 | (local_e8.sa_data._2_4_ & 0xff0000) >> 8 |
                (local_e8.sa_data._2_4_ & 0xff00) << 8 | local_e8.sa_data._2_4_ << 0x18;
        local_140.data_._0_4_ = (uint)(uVar5 >= uVar7 && uVar5 != uVar7) - (uint)(uVar5 < uVar7);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_138,"0",
                   "memcmp(&test_addr.sin_addr, &ipv4.sin_addr, sizeof(ipv4.sin_addr))",
                   (int *)&local_148,(int *)&local_140);
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x129,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        msgint = (stun_attr_msgint *)stun_msg_next_attr(local_b8,(stun_attr_hdr *)attr_00);
        local_148.data_._0_4_ = 8;
        uVar3 = stun_attr_type((stun_attr_hdr *)msgint);
        local_140.data_._0_2_ = uVar3;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&local_138,"STUN_ATTR_MESSAGE_INTEGRITY","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_148,(unsigned_short *)&local_140);
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,300,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_148.data_._0_4_ = 1;
        iVar4 = stun_attr_msgint_check(msgint,local_b8,local_d8,0x16);
        local_140.data_._0_4_ = iVar4;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_138,"1",
                   "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                   ,(int *)&local_148,(int *)&local_140);
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x12e,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        attr_hdr = stun_msg_next_attr(local_b8,(stun_attr_hdr *)msgint);
        local_148.data_._0_4_ = 0x8028;
        uVar3 = stun_attr_type(attr_hdr);
        local_140.data_._0_2_ = uVar3;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&local_138,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_148,(unsigned_short *)&local_140);
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x131,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_148.data_ = (AssertHelperData *)stun_msg_next_attr(local_b8,attr_hdr);
        local_140.data_ = (AssertHelperData *)0x0;
        testing::internal::CmpHelperEQ<_stun_attr_hdr_const*,_stun_attr_hdr_const*>
                  ((internal *)&local_138,"__null","attr_hdr",(_stun_attr_hdr **)&local_140,
                   (_stun_attr_hdr **)&local_148);
        if (local_138.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_148);
          if (local_130.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((local_130.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x134,pcVar10);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          if (local_148.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_148.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_148.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
  }
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name)-1)
    + STUN_ATTR_SOCKADDR_SIZE(STUN_IPV4)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_UINT32_SIZE];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr_init(msg_hdr, STUN_BINDING_RESPONSE, tsx_id);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
      sizeof(software_name)-1, ' ');
  stun_attr_xor_sockaddr_add(msg_hdr, STUN_ATTR_XOR_MAPPED_ADDRESS,
      (sockaddr*)&ipv4);
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_XOR_MAPPED_ADDRESS, stun_attr_type(attr_hdr));
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_EQ(STUN_OK, stun_attr_xor_sockaddr_read(
      (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}